

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

void __thiscall ASTree::expandDot(ASTree *this,Graph *graph)

{
  ASTree *ast;
  pointer ppAVar1;
  string nameSub;
  string name;
  allocator<char> local_181;
  ASTree *local_180;
  pointer local_178;
  string local_170;
  string local_150;
  string local_130;
  Node local_110;
  Connection local_90;
  
  dotName_abi_cxx11_(&local_150,this,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"circle",(allocator<char> *)&local_130);
  Node::Node(&local_110,&local_150,&this->root,&local_170);
  Graph::addNode(graph,&local_110);
  Node::~Node(&local_110);
  std::__cxx11::string::~string((string *)&local_170);
  local_178 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_180 = this;
  for (ppAVar1 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar1 != local_178; ppAVar1 = ppAVar1 + 1) {
    ast = *ppAVar1;
    dotName_abi_cxx11_(&local_170,local_180,ast);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_181);
    Connection::Connection(&local_90,&local_150,&local_170,&local_130);
    Graph::addConnection(graph,&local_90);
    Connection::~Connection(&local_90);
    std::__cxx11::string::~string((string *)&local_130);
    expandDot(ast,graph);
    std::__cxx11::string::~string((string *)&local_170);
  }
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void ASTree::expandDot(Graph &graph) {


    std::string name = dotName(this);

    graph.addNode(Node(name, root, "circle"));

    for (auto subtree: subtrees) {

        std::string nameSub = dotName(subtree);

        graph.addConnection(Connection(name, nameSub, ""));

        subtree->expandDot(graph);
    }
}